

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  aiVector3D **__s;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t __n;
  VertexData *this_00;
  pointer pVVar3;
  aiFace *paVar4;
  pointer ppBVar5;
  int iVar6;
  element_type *peVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  iterator __end2;
  aiMesh *paVar10;
  VertexData **ppVVar11;
  ulong *puVar12;
  aiFace *paVar13;
  aiVector3D *paVar14;
  MemoryStream *pMVar15;
  size_t sVar16;
  Logger *pLVar17;
  void *pvVar18;
  uint *puVar19;
  aiBone **ppaVar20;
  pointer ppBVar21;
  mapped_type *boneWeights;
  aiBone *paVar22;
  _Base_ptr p_Var23;
  runtime_error *prVar24;
  VertexElement *element_3;
  pointer pVVar25;
  Type type;
  Type type_00;
  VertexElement *element;
  pointer pVVar26;
  size_t ii;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  pointer pVVar30;
  Bone *pBVar31;
  pointer pVVar32;
  long lVar33;
  Bone *this_01;
  size_t v;
  long lVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> referencedBones;
  uint16_t iout;
  aiVector3D *local_2f0;
  MemoryStream *local_2d8;
  MemoryStream *local_2d0;
  aiVector3D *local_2c8;
  MemoryStream *local_2c0;
  size_t local_280;
  ulong local_278;
  size_t local_270;
  ulong local_268;
  size_t local_260;
  ulong local_258;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_238;
  string local_208;
  aiBone ***local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  element_type *local_1d0;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  size_t local_1b0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only mesh operation type OT_TRIANGLE_LIST is supported. Found "
               ,0x3e);
    std::ostream::operator<<(local_1a8,(this->super_ISubMesh).operationType);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar24,(string *)&local_238);
    *(undefined ***)prVar24 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar10 = (aiMesh *)operator_new(0x520);
  paVar10->mNumVertices = 0;
  paVar10->mNumFaces = 0;
  __s = &paVar10->mVertices;
  memset(__s,0,0xcc);
  paVar10->mBones = (aiBone **)0x0;
  paVar10->mMaterialIndex = 0;
  (paVar10->mName).length = 0;
  (paVar10->mName).data[0] = '\0';
  memset((paVar10->mName).data + 1,0x1b,0x3ff);
  paVar10->mNumAnimMeshes = 0;
  paVar10->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar10->mMethod = 0;
  (paVar10->mAABB).mMin.x = 0.0;
  (paVar10->mAABB).mMin.y = 0.0;
  (paVar10->mAABB).mMin.z = 0.0;
  (paVar10->mAABB).mMax.x = 0.0;
  (paVar10->mAABB).mMax.y = 0.0;
  (paVar10->mAABB).mMax.z = 0.0;
  memset(paVar10->mColors,0,0xa0);
  paVar10->mPrimitiveTypes = 4;
  __n = (this->super_ISubMesh).name._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (paVar10->mName).length = (ai_uint32)__n;
    memcpy((paVar10->mName).data,(this->super_ISubMesh).name._M_dataplus._M_p,__n);
    (paVar10->mName).data[__n] = '\0';
  }
  uVar2 = (this->super_ISubMesh).materialIndex;
  if (uVar2 != 0xffffffff) {
    paVar10->mMaterialIndex = uVar2;
  }
  ppVVar11 = &this->vertexData;
  if ((this->super_ISubMesh).usesSharedVertexData != false) {
    ppVVar11 = &parent->sharedVertexData;
  }
  this_00 = *ppVVar11;
  pVVar25 = (this_00->vertexElements).
            super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this_00->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar25 == pVVar3) {
LAB_00468181:
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e8 = &paVar10->mBones;
  pVVar26 = pVVar25;
  do {
    pVVar30 = pVVar25;
    if ((pVVar26->semantic == VES_POSITION) && (pVVar26->index == 0)) goto LAB_00467693;
    pVVar26 = pVVar26 + 1;
  } while (pVVar26 != pVVar3);
  pVVar26 = (pointer)0x0;
LAB_00467693:
  do {
    pVVar32 = pVVar25;
    if ((pVVar30->semantic == VES_NORMAL) && (pVVar30->index == 0)) goto LAB_004676ad;
    pVVar30 = pVVar30 + 1;
  } while (pVVar30 != pVVar3);
  pVVar30 = (pointer)0x0;
LAB_004676ad:
  do {
    if ((pVVar32->semantic == VES_TEXTURE_COORDINATES) && (pVVar32->index == 0)) goto LAB_004676c4;
    pVVar32 = pVVar32 + 1;
  } while (pVVar32 != pVVar3);
  pVVar32 = (pointer)0x0;
LAB_004676c4:
  do {
    if ((pVVar25->semantic == VES_TEXTURE_COORDINATES) && (pVVar25->index == 1)) goto LAB_004676db;
    pVVar25 = pVVar25 + 1;
  } while (pVVar25 != pVVar3);
  pVVar25 = (pointer)0x0;
LAB_004676db:
  if (pVVar26 == (pointer)0x0) goto LAB_00468181;
  if (pVVar26->type != VET_FLOAT3) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((pVVar30 != (pointer)0x0) && (pVVar30->type != VET_FLOAT3)) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,"");
    std::runtime_error::runtime_error(prVar24,(string *)local_1a8);
    *(undefined ***)prVar24 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->indexData->faceCount;
  uVar28 = (ulong)uVar2;
  paVar10->mNumFaces = uVar2;
  puVar12 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
  paVar4 = (aiFace *)(puVar12 + 1);
  *puVar12 = uVar28;
  if (uVar28 != 0) {
    paVar13 = paVar4;
    do {
      paVar13->mNumIndices = 0;
      paVar13->mIndices = (uint *)0x0;
      paVar13 = paVar13 + 1;
    } while (paVar13 != paVar4 + uVar28);
  }
  paVar10->mFaces = paVar4;
  paVar10->mNumVertices = uVar2 * 3;
  uVar27 = (ulong)(uVar2 * 3) * 0xc;
  paVar14 = (aiVector3D *)operator_new__(uVar27);
  if (uVar28 != 0) {
    memset(paVar14,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
  }
  *__s = paVar14;
  pMVar15 = VertexData::VertexBuffer(this_00,pVVar26->source);
  if (pVVar30 == (pointer)0x0) {
    local_2c0 = (MemoryStream *)0x0;
  }
  else {
    local_2c0 = VertexData::VertexBuffer(this_00,pVVar30->source);
  }
  if (pVVar32 == (pointer)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else {
    local_2d0 = VertexData::VertexBuffer(this_00,pVVar32->source);
  }
  if (pVVar25 == (pointer)0x0) {
    local_2d8 = (MemoryStream *)0x0;
  }
  else {
    local_2d8 = VertexData::VertexBuffer(this_00,pVVar25->source);
  }
  local_1b0 = VertexElement::TypeSize(pVVar26->type);
  if (pVVar30 == (pointer)0x0) {
    local_260 = 0;
  }
  else {
    local_260 = VertexElement::TypeSize(pVVar30->type);
  }
  if (pVVar32 == (pointer)0x0) {
    local_270 = 0;
  }
  else {
    local_270 = VertexElement::TypeSize(pVVar32->type);
  }
  if (pVVar25 == (pointer)0x0) {
    local_280 = 0;
  }
  else {
    local_280 = VertexElement::TypeSize(pVVar25->type);
  }
  uVar8 = VertexData::VertexSize(this_00,pVVar26->source);
  if (pVVar30 == (pointer)0x0) {
    local_258 = 0;
  }
  else {
    uVar9 = VertexData::VertexSize(this_00,pVVar30->source);
    local_258 = (ulong)uVar9;
  }
  if (pVVar32 == (pointer)0x0) {
    local_268 = 0;
  }
  else {
    uVar9 = VertexData::VertexSize(this_00,pVVar32->source);
    local_268 = (ulong)uVar9;
  }
  if (pVVar25 == (pointer)0x0) {
    local_278 = 0;
  }
  else {
    uVar9 = VertexData::VertexSize(this_00,pVVar25->source);
    local_278 = (ulong)uVar9;
  }
  local_1d8 = (this_00->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (this_00->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2c0 != (MemoryStream *)0x0) {
    paVar14 = (aiVector3D *)operator_new__(uVar27);
    if (uVar28 != 0) {
      memset(paVar14,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar10->mNormals = paVar14;
  }
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else if (pVVar32->type - VET_FLOAT2 < 2) {
    sVar16 = VertexElement::ComponentCount(pVVar32->type);
    paVar10->mNumUVComponents[0] = (uint)sVar16;
    paVar14 = (aiVector3D *)operator_new__(uVar27);
    if (uVar28 != 0) {
      memset(paVar14,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar10->mTextureCoords[0] = paVar14;
  }
  else {
    pLVar17 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
    VertexElement::TypeToString_abi_cxx11_(&local_208,(VertexElement *)(ulong)pVVar32->type,type);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar17,(char *)local_238._M_impl._0_8_);
    if ((_Base_ptr *)local_238._M_impl._0_8_ !=
        &local_238._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_238._M_impl._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2d0 = (MemoryStream *)0x0;
  }
  if (local_2d8 != (MemoryStream *)0x0) {
    if (pVVar25->type - VET_FLOAT2 < 2) {
      sVar16 = VertexElement::ComponentCount(pVVar25->type);
      paVar10->mNumUVComponents[1] = (uint)sVar16;
      paVar14 = (aiVector3D *)operator_new__(uVar27);
      if (uVar28 != 0) {
        memset(paVar14,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar10->mTextureCoords[1] = paVar14;
      goto LAB_00467cd2;
    }
    pLVar17 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
    VertexElement::TypeToString_abi_cxx11_(&local_208,(VertexElement *)(ulong)pVVar25->type,type_00)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar17,(char *)local_238._M_impl._0_8_);
    if ((_Base_ptr *)local_238._M_impl._0_8_ !=
        &local_238._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_238._M_impl._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  local_2d8 = (MemoryStream *)0x0;
LAB_00467cd2:
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2f0 = (aiVector3D *)0x0;
  }
  else {
    local_2f0 = paVar10->mTextureCoords[0];
  }
  if (local_2d8 == (MemoryStream *)0x0) {
    local_2c8 = (aiVector3D *)0x0;
  }
  else {
    local_2c8 = paVar10->mTextureCoords[1];
  }
  bVar36 = this->indexData->is32bit;
  local_1c8 = 6;
  if (bVar36 != false) {
    local_1c8 = 0xc;
  }
  if (uVar28 != 0) {
    local_1b8 = (ulong)uVar8;
    local_1d0 = (this->indexData->buffer).
                super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar29 = (ulong)bVar36 * 2 + 2;
    bVar36 = local_2f0 != (aiVector3D *)0x0;
    bVar37 = local_2c8 != (aiVector3D *)0x0;
    lVar35 = 0;
    iVar6 = 0;
    uVar28 = 0;
    do {
      peVar7 = local_1d0;
      pvVar18 = operator_new__(0xc);
      (*(peVar7->super_IOStream)._vptr_IOStream[4])(peVar7,uVar28 * local_1c8,0);
      if (this->indexData->is32bit == true) {
        (*(peVar7->super_IOStream)._vptr_IOStream[2])(peVar7,pvVar18,lVar29,3);
      }
      else {
        local_1a8[0]._M_impl._0_8_ = local_1a8[0]._M_impl._0_8_ & 0xffffffffffff0000;
        lVar33 = 0;
        do {
          (*(peVar7->super_IOStream)._vptr_IOStream[2])(peVar7,local_1a8,lVar29,1);
          *(uint *)((long)pvVar18 + lVar33 * 4) = (uint)(ushort)local_1a8[0]._M_impl._0_2_;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
      }
      paVar4 = paVar10->mFaces;
      paVar4[uVar28].mNumIndices = 3;
      local_1c0 = uVar28;
      puVar19 = (uint *)operator_new__(0xc);
      paVar4[uVar28].mIndices = puVar19;
      lVar33 = 0;
      lVar34 = 0;
      do {
        uVar8 = iVar6 + (int)lVar34;
        paVar4[uVar28].mIndices[lVar34] = uVar8;
        uVar2 = *(uint *)((long)pvVar18 + lVar34 * 4);
        uVar27 = (ulong)uVar2;
        IVertexData::AddVertexMapping(&this_00->super_IVertexData,uVar2,uVar8);
        (*(pMVar15->super_IOStream)._vptr_IOStream[4])
                  (pMVar15,(ulong)pVVar26->offset + uVar27 * local_1b8,0);
        (*(pMVar15->super_IOStream)._vptr_IOStream[2])
                  (pMVar15,(long)&(*__s)->x + lVar33 + lVar35,local_1b0,1);
        if (local_2c0 != (MemoryStream *)0x0) {
          (*(local_2c0->super_IOStream)._vptr_IOStream[4])
                    (local_2c0,(ulong)pVVar30->offset + local_258 * uVar27,0);
          (*(local_2c0->super_IOStream)._vptr_IOStream[2])
                    (local_2c0,(long)&paVar10->mNormals->x + lVar33 + lVar35,local_260,1);
        }
        if (bVar36 && local_2d0 != (MemoryStream *)0x0) {
          (*(local_2d0->super_IOStream)._vptr_IOStream[4])
                    (local_2d0,(ulong)pVVar32->offset + local_268 * uVar27,0);
          (*(local_2d0->super_IOStream)._vptr_IOStream[2])
                    (local_2d0,(long)&local_2f0->x + lVar33,local_270,1);
          *(float *)((long)&local_2f0->y + lVar33) = 1.0 - *(float *)((long)&local_2f0->y + lVar33);
        }
        if (bVar37 && local_2d8 != (MemoryStream *)0x0) {
          (*(local_2d8->super_IOStream)._vptr_IOStream[4])
                    (local_2d8,(ulong)pVVar25->offset + uVar27 * local_278,0);
          (*(local_2d8->super_IOStream)._vptr_IOStream[2])
                    (local_2d8,(long)&local_2c8->x + lVar33,local_280,1);
          *(float *)((long)&local_2c8->y + lVar33) = 1.0 - *(float *)((long)&local_2c8->y + lVar33);
        }
        lVar34 = lVar34 + 1;
        lVar33 = lVar33 + 0xc;
      } while (lVar33 != 0x24);
      operator_delete__(pvVar18);
      uVar28 = local_1c0 + 1;
      iVar6 = iVar6 + 3;
      lVar35 = lVar35 + 0x24;
      local_2f0 = local_2f0 + 3;
      local_2c8 = local_2c8 + 3;
    } while (uVar28 < paVar10->mNumFaces);
  }
  if ((local_1d8 != local_1e0) && (parent->skeleton != (Skeleton *)0x0)) {
    IVertexData::AssimpBoneWeights
              ((AssimpVertexBoneWeightList *)local_1a8,&this_00->super_IVertexData,
               (ulong)paVar10->mNumVertices);
    IVertexData::ReferencedBonesByWeights
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               &local_238,&this_00->super_IVertexData);
    paVar10->mNumBones = (uint)local_238._M_impl.super__Rb_tree_header._M_node_count;
    ppaVar20 = (aiBone **)
               operator_new__((local_238._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff)
                              << 3);
    *local_1e8 = ppaVar20;
    p_Var1 = &local_238._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_238._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      lVar29 = 0;
      p_Var23 = local_238._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        ppBVar21 = (parent->skeleton->bones).
                   super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppBVar5 = (parent->skeleton->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppBVar21 != ppBVar5) {
          do {
            this_01 = *ppBVar21;
            if (this_01->id == (short)p_Var23[1]._M_color) goto LAB_00468120;
            ppBVar21 = ppBVar21 + 1;
          } while (ppBVar21 != ppBVar5);
        }
        this_01 = (Bone *)0x0;
LAB_00468120:
        pBVar31 = this_01;
        boneWeights = std::
                      map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                      ::operator[]((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                    *)local_1a8,&this_01->id);
        paVar22 = Bone::ConvertToAssimpBone(this_01,(Skeleton *)pBVar31,boneWeights);
        ppaVar20[lVar29] = paVar22;
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        lVar29 = lVar29 + 1;
      } while ((_Rb_tree_header *)p_Var23 != p_Var1);
    }
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree(&local_238);
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
    ::~_Rb_tree(local_1a8);
  }
  return paVar10;
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}